

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::addExpr(Parser *this)

{
  Token token;
  Lexer *pLVar1;
  Report *this_00;
  _Head_base<0UL,_flow::lang::Expr_*,_false> _Var2;
  _Alloc_hider _Var3;
  Opcode OVar4;
  LiteralType args;
  LiteralType args_2;
  _Base_ptr p_Var5;
  Parser *in_RSI;
  Opcode opc;
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_70;
  undefined1 local_64 [4];
  undefined1 local_60 [16];
  string local_50;
  
  mulExpr((Parser *)&local_70);
  if ((_Base_ptr)local_70._M_head_impl == (_Base_ptr)0x0) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
    p_Var5 = *(_Base_ptr *)&(this->features_)._M_t._M_impl;
    do {
      token = ((in_RSI->lexer_)._M_t.
               super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
               _M_t.
               super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
               super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_;
      if (1 < token - Plus) {
        *(Expr **)&(this->features_)._M_t._M_impl = local_70._M_head_impl;
        return (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>)this;
      }
      nextToken(in_RSI);
      mulExpr((Parser *)local_60);
      if ((_Base_ptr)local_60._0_8_ == (_Base_ptr)0x0) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        goto LAB_00125b79;
      }
      OVar4 = makeOperator(token,local_70._M_head_impl,(Expr *)local_60._0_8_);
      local_64._0_2_ = OVar4;
      if (OVar4 == EXIT) {
        pLVar1 = (in_RSI->lexer_)._M_t.
                 super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                 .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        this_00 = in_RSI->report_;
        local_60._8_8_ = p_Var5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Incompatible binary expression operands ({} {} {}).",
                   (allocator<char> *)(local_64 + 3));
        args = (*((local_70._M_head_impl)->super_ASTNode)._vptr_ASTNode[3])();
        args_2 = (**(code **)(*(long *)local_60._0_8_ + 0x18))();
        diagnostics::Report::typeError<flow::LiteralType,flow::lang::Token,flow::LiteralType>
                  (this_00,&pLVar1->lastLocation_,&local_50,args,token,args_2);
        std::__cxx11::string::~string((string *)&local_50);
        p_Var5 = (_Base_ptr)0x0;
      }
      else {
        std::
        make_unique<flow::lang::BinaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
                  ((Opcode *)&local_50,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_64,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_70
                  );
        _Var3._M_p = local_50._M_dataplus._M_p;
        _Var2._M_head_impl = local_70._M_head_impl;
        local_50._M_dataplus._M_p = (pointer)0x0;
        local_70._M_head_impl = (Expr *)_Var3._M_p;
        if (((_Base_ptr)_Var2._M_head_impl != (_Base_ptr)0x0) &&
           ((*((_Var2._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])(),
           (_Base_ptr)local_50._M_dataplus._M_p != (_Base_ptr)0x0)) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
      }
      if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_60._0_8_ + 8))();
      }
    } while (OVar4 != EXIT);
    *(_Base_ptr *)&(this->features_)._M_t._M_impl = p_Var5;
LAB_00125b79:
    if ((_Base_ptr)local_70._M_head_impl != (_Base_ptr)0x0) {
      (*((local_70._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
    }
  }
  return (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::addExpr() {
  std::unique_ptr<Expr> lhs = mulExpr();
  if (!lhs) return nullptr;

  for (;;) {
    switch (token()) {
      case Token::Plus:
      case Token::Minus: {
        Token binop = token();
        nextToken();

        std::unique_ptr<Expr> rhs = mulExpr();
        if (!rhs) return nullptr;

        Opcode opc = makeOperator(binop, lhs.get(), rhs.get());
        if (opc == Opcode::EXIT) {
          report_.typeError(
              lastLocation(),
              "Incompatible binary expression operands ({} {} {}).",
              lhs->getType(), binop, rhs->getType());
          return nullptr;
        }

        lhs = std::make_unique<BinaryExpr>(opc, std::move(lhs), std::move(rhs));
        break;
      }
      default:
        return lhs;
    }
  }
}